

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O2

int tpm_socket_read(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  uchar **ppuVar1;
  ulong uVar2;
  LOGGER_LOG p_Var3;
  ssize_t sVar4;
  uchar *puVar5;
  uchar *__dest;
  int iVar6;
  ulong __size;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  ulong __n;
  bool bVar11;
  undefined1 local_438 [1032];
  
  __n = (ulong)bytes_len;
  if (bytes_len == 0 || (tpm_bytes == (uchar *)0x0 || handle == (TPM_SOCKET_HANDLE)0x0)) {
    p_Var3 = xlogging_get_log_function();
    iVar6 = 0x101;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_read",0x100,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,__n);
    }
  }
  else {
    ppuVar1 = &handle->recv_bytes;
    lVar9 = 2;
    while (bVar11 = lVar9 != 0, lVar9 = lVar9 + -1, bVar11) {
      if (__n <= handle->recv_length) {
        memcpy(tpm_bytes,handle->recv_bytes,__n);
        sVar10 = handle->recv_length - __n;
        if (sVar10 == 0) {
          free(*ppuVar1);
          *ppuVar1 = (uchar *)0x0;
          handle->recv_length = 0;
          return 0;
        }
        if (sVar10 == 0xffffffffffffffff || handle->recv_length < __n) {
          return 0;
        }
        __dest = (uchar *)malloc(sVar10);
        puVar5 = handle->recv_bytes;
        memcpy(__dest,puVar5 + __n,sVar10);
        free(puVar5);
        handle->recv_bytes = __dest;
        handle->recv_length = sVar10;
        return 0;
      }
      sVar4 = recv(handle->socket_conn,local_438,0x400,0);
      if ((int)sVar4 == -1) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0010c469;
        pcVar7 = "Failure received bytes timed out.";
        iVar6 = 0xa2;
LAB_0010c464:
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"read_socket_bytes",iVar6,1,pcVar7);
LAB_0010c469:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x115;
        }
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_read",0x114,1,"Failure reading socket bytes.");
        return 0x115;
      }
      __size = (ulong)(int)sVar4;
      if (*ppuVar1 != (uchar *)0x0) {
        sVar10 = 0xffffffffffffffff;
        if (!CARRY8(handle->recv_length,__size)) {
          sVar10 = handle->recv_length + __size;
        }
        if (sVar10 != 0xffffffffffffffff) {
          puVar5 = (uchar *)realloc(*ppuVar1,sVar10);
          goto LAB_0010c37f;
        }
LAB_0010c437:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0010c469;
        pcVar7 = "Failure: adding bytes to buffer.";
        iVar6 = 0xb1;
        goto LAB_0010c464;
      }
      puVar5 = (uchar *)malloc(__size);
LAB_0010c37f:
      if (puVar5 == (uchar *)0x0) goto LAB_0010c437;
      uVar2 = handle->recv_length;
      sVar8 = __size + uVar2;
      if (CARRY8(__size,uVar2)) {
        sVar8 = 0xffffffffffffffff;
      }
      if (sVar8 == 0xffffffffffffffff) {
        free(puVar5);
        goto LAB_0010c437;
      }
      handle->recv_bytes = puVar5;
      memcpy(puVar5 + uVar2,local_438,__size);
      handle->recv_length = sVar8;
    }
    iVar6 = 0x106;
  }
  return iVar6;
}

Assistant:

int tpm_socket_read(TPM_SOCKET_HANDLE handle, unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        // Do we have enough bytes cached
        result = MU_FAILURE;
        for (size_t index = 0; index < 2; index++)
        {
            if (handle->recv_length >= bytes_len)
            {
                memcpy(tpm_bytes, handle->recv_bytes, bytes_len);
                remove_from_buffer(handle, bytes_len);
                result = 0;
                break;
            }
            else
            {
                if (read_socket_bytes(handle))
                {
                    LogError("Failure reading socket bytes.");
                    result = MU_FAILURE;
                    break;
                }
            }
        }
    }
    return result;
}